

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest::ParseSchema
          (RetentionStripTest *this,string_view contents,string_view file_name)

{
  string *psVar1;
  bool bVar2;
  FileDescriptor *pFVar3;
  Arena *arena;
  size_t in_R9;
  Metadata MVar4;
  string_view format;
  FakeErrorCollector error_collector;
  string proto_file;
  ArrayInputStream input_stream;
  Parser parser;
  FileDescriptorProto file_descriptor;
  Tokenizer tokenizer;
  ErrorCollector local_2c8;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  LogMessageFatal local_2a0;
  ArrayInputStream local_290;
  Parser local_270;
  undefined1 local_1e8 [248];
  Tokenizer local_f0;
  
  MVar4 = FileDescriptorSet::GetMetadata((FileDescriptorSet *)_FileDescriptorSet_default_instance_);
  psVar1 = (MVar4.descriptor)->file_->name_;
  local_1e8._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_1e8._0_8_ = psVar1->_M_string_length;
  local_2b8 = 0;
  local_2b0 = 0;
  format._M_str = local_1e8;
  format._M_len =
       (size_t)
       "\n          syntax = \"proto2\";\n\n          package google.protobuf.internal;\n\n          import \"$0\";\n\n          $1\n        "
  ;
  local_2c0 = &local_2b0;
  local_1e8._16_8_ = contents._M_len;
  local_1e8._24_8_ = contents._M_str;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_2c0,(Nonnull<std::string_*>)0x79,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  io::ArrayInputStream::ArrayInputStream(&local_290,local_2c0,(int)local_2b8,-1);
  local_2c8._vptr_ErrorCollector = (_func_int **)&PTR__ErrorCollector_018e1890;
  io::Tokenizer::Tokenizer(&local_f0,&local_290.super_ZeroCopyInputStream,&local_2c8);
  Parser::Parser(&local_270);
  local_270.error_collector_ = &local_2c8;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1e8,(Arena *)0x0);
  bVar2 = Parser::Parse(&local_270,&local_f0,(FileDescriptorProto *)local_1e8);
  if (bVar2) {
    local_1e8._16_8_ = local_1e8._16_8_ | 1;
    arena = (Arena *)local_1e8._8_8_;
    if ((local_1e8._8_8_ & 1) != 0) {
      arena = *(Arena **)(local_1e8._8_8_ & 0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)(local_1e8 + 200),file_name,arena);
    pFVar3 = DescriptorPool::BuildFile(&this->pool_,(FileDescriptorProto *)local_1e8);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1e8);
    Parser::~Parser(&local_270);
    io::Tokenizer::~Tokenizer(&local_f0);
    io::ErrorCollector::~ErrorCollector(&local_2c8);
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
    }
    return pFVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_2a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
             ,0x50,"parser.Parse(&tokenizer, &file_descriptor)");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_2a0);
}

Assistant:

const FileDescriptor* ParseSchema(absl::string_view contents,
                                    absl::string_view file_name = "foo.proto") {
    std::string proto_file = absl::Substitute(
        R"schema(
          syntax = "proto2";

          package google.protobuf.internal;

          import "$0";

          $1
        )schema",
        FileDescriptorSet::descriptor()->file()->name(), contents);
    io::ArrayInputStream input_stream(proto_file.data(),
                                      static_cast<int>(proto_file.size()));
    FakeErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto file_descriptor;
    ABSL_CHECK(parser.Parse(&tokenizer, &file_descriptor));
    file_descriptor.set_name(file_name);

    return pool_.BuildFile(file_descriptor);
  }